

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *main_dependency,cmCustomCommandLines *commandLines,char *comment,
          char *workingDir,bool replace,bool escapeOldStyle,bool uses_terminal,
          bool command_expand_lists,string *depfile,string *job_pool)

{
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  cmCustomCommand *pcVar7;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar8;
  cmGlobalGenerator *pcVar9;
  const_reference pvVar10;
  cmSourceFile *pcVar11;
  cmCustomCommandLines local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  cmCustomCommand *local_3a8;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  string local_380;
  cmSourceFile *local_360;
  cmSourceFile *out_1;
  string *o_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string local_330;
  cmSourceFile *local_310;
  cmSourceFile *out;
  string *o;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_2e0;
  int local_2bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string outName;
  cmGlobalGenerator *gg;
  cmSourceFile *file;
  ostringstream local_228 [8];
  ostringstream e;
  cmCustomCommandLine *cl;
  const_iterator __end1;
  const_iterator __begin1;
  cmCustomCommandLines *__range1;
  allocator<char> local_79;
  string local_78;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  bool command_expand_lists_local;
  bool uses_terminal_local;
  bool escapeOldStyle_local;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvStack_50;
  bool replace_local;
  cmCustomCommandLines *commandLines_local;
  string *main_dependency_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmMakefile *this_local;
  
  local_51 = replace;
  local_52 = escapeOldStyle;
  local_53 = uses_terminal;
  local_54 = command_expand_lists;
  pvStack_50 = &commandLines->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  commandLines_local = (cmCustomCommandLines *)main_dependency;
  main_dependency_local = (string *)depends;
  depends_local = byproducts;
  byproducts_local = outputs;
  outputs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(outputs);
  pvVar1 = pvStack_50;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Attempt to add a custom rule with no output!",&local_79);
    cmSystemTools::Error(&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    this_local = (cmMakefile *)0x0;
  }
  else {
    __end1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                       (pvStack_50);
    cl = (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end(pvVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                                       *)&cl), bVar2) {
      pvVar3 = &__gnu_cxx::
                __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                ::operator*(&__end1)->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(pvVar3);
      if (!bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvVar3,0);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](pvVar3,0);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar10);
          if (*pcVar4 == '\"') {
            std::__cxx11::ostringstream::ostringstream(local_228);
            poVar5 = std::operator<<((ostream *)local_228,
                                     "COMMAND may not contain literal quotes:\n  ");
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](pvVar3,0);
            poVar5 = std::operator<<(poVar5,(string *)pvVar10);
            std::operator<<(poVar5,"\n");
            std::__cxx11::ostringstream::str();
            IssueMessage(this,FATAL_ERROR,(string *)&file);
            std::__cxx11::string::~string((string *)&file);
            this_local = (cmMakefile *)0x0;
            std::__cxx11::ostringstream::~ostringstream(local_228);
            return (cmSourceFile *)this_local;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
      ::operator++(&__end1);
    }
    gg = (cmGlobalGenerator *)0x0;
    bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                      (pvStack_50);
    if ((!bVar2) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
      gg = (cmGlobalGenerator *)GetSource(this,(string *)commandLines_local,Ambiguous);
      if ((gg == (cmGlobalGenerator *)0x0) ||
         ((pcVar7 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg), pvVar1 = pvStack_50,
          pcVar7 == (cmCustomCommand *)0x0 || ((local_51 & 1) != 0)))) {
        if (gg == (cmGlobalGenerator *)0x0) {
          gg = (cmGlobalGenerator *)CreateSource(this,(string *)commandLines_local,false,Ambiguous);
        }
      }
      else {
        pcVar7 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg);
        pvVar8 = &cmCustomCommand::GetCommandLines(pcVar7)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar2 = std::operator==(pvVar1,pvVar8);
        if (bVar2) {
          return (cmSourceFile *)gg;
        }
        gg = (cmGlobalGenerator *)0x0;
      }
    }
    if (gg == (cmGlobalGenerator *)0x0) {
      pcVar9 = GetGlobalGenerator(this);
      outName.field_2._8_8_ = pcVar9;
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](byproducts_local,0);
      (*pcVar9->_vptr_cmGlobalGenerator[0x2b])((string *)local_278,pcVar9,pvVar10);
      gg = (cmGlobalGenerator *)GetSource(this,(string *)local_278,Known);
      if ((((cmMakefile *)gg == (cmMakefile *)0x0) ||
          (pcVar7 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg), pvVar1 = pvStack_50,
          pcVar7 == (cmCustomCommand *)0x0)) || ((local_51 & 1) != 0)) {
        if ((cmMakefile *)gg == (cmMakefile *)0x0) {
          gg = (cmGlobalGenerator *)CreateSource(this,(string *)local_278,true,Known);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"__CMAKE_RULE",(allocator<char> *)((long)&__range1_1 + 7));
        cmSourceFile::SetProperty((cmSourceFile *)gg,&local_2e0,"1");
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
        local_2bc = 0;
      }
      else {
        pcVar7 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg);
        pvVar8 = &cmCustomCommand::GetCommandLines(pcVar7)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar2 = std::operator!=(pvVar1,pvVar8);
        if (bVar2) {
          std::operator+(&local_2b8,"Attempt to add a custom rule to output \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
          std::operator+(&local_298,&local_2b8,"\" which already has a custom rule.");
          cmSystemTools::Error(&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
        }
        local_2bc = 1;
        this_local = (cmMakefile *)gg;
      }
      std::__cxx11::string::~string((string *)local_278);
      if (local_2bc != 0) {
        return (cmSourceFile *)this_local;
      }
    }
    pvVar3 = byproducts_local;
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(byproducts_local);
    o = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&o), pvVar3 = depends_local, bVar2) {
      out = (cmSourceFile *)
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1_1);
      pcVar11 = GetOrCreateSource(this,(string *)out,true,Known);
      local_310 = pcVar11;
      if (pcVar11 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_330,"GENERATED",(allocator<char> *)((long)&__range1_2 + 7));
        cmSourceFile::SetProperty(pcVar11,&local_330,"1");
        std::__cxx11::string::~string((string *)&local_330);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    __end1_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(depends_local);
    o_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&o_1), bVar2) {
      out_1 = (cmSourceFile *)
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_2);
      pcVar11 = GetOrCreateSource(this,(string *)out_1,true,Known);
      local_360 = pcVar11;
      if (pcVar11 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"GENERATED",
                   (allocator<char> *)
                   ((long)&depends2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmSourceFile::SetProperty(pcVar11,&local_380,"1");
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&depends2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_2);
    }
    if (gg != (cmGlobalGenerator *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cc,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)main_dependency_local);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,(value_type *)commandLines_local);
      }
      pcVar7 = (cmCustomCommand *)operator_new(0x110);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3c0,byproducts_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3d8,depends_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3f0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cc);
      cmCustomCommandLines::cmCustomCommandLines(&local_408,(cmCustomCommandLines *)pvStack_50);
      cmCustomCommand::cmCustomCommand
                (pcVar7,this,&local_3c0,&local_3d8,&local_3f0,&local_408,comment,workingDir);
      cmCustomCommandLines::~cmCustomCommandLines(&local_408);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3c0);
      local_3a8 = pcVar7;
      cmCustomCommand::SetEscapeOldStyle(pcVar7,(bool)(local_52 & 1));
      cmCustomCommand::SetEscapeAllowMakeVars(local_3a8,true);
      cmCustomCommand::SetUsesTerminal(local_3a8,(bool)(local_53 & 1));
      cmCustomCommand::SetCommandExpandLists(local_3a8,(bool)(local_54 & 1));
      cmCustomCommand::SetDepfile(local_3a8,depfile);
      cmCustomCommand::SetJobPool(local_3a8,job_pool);
      cmSourceFile::SetCustomCommand((cmSourceFile *)gg,local_3a8);
      UpdateOutputToSourceMap(this,byproducts_local,(cmSourceFile *)gg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cc);
    }
    this_local = (cmMakefile *)gg;
  }
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmMakefile::AddCustomCommandToOutput(
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends, const std::string& main_dependency,
  const cmCustomCommandLines& commandLines, const char* comment,
  const char* workingDir, bool replace, bool escapeOldStyle,
  bool uses_terminal, bool command_expand_lists, const std::string& depfile,
  const std::string& job_pool)
{
  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return nullptr;
  }

  // Validate custom commands.  TODO: More strict?
  for (cmCustomCommandLine const& cl : commandLines) {
    if (!cl.empty() && !cl[0].empty() && cl[0][0] == '"') {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return nullptr;
    }
  }

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && !main_dependency.empty()) {
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = this->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = this->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = this->GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(outputs[0]);

    // Check if the rule file already exists.
    file = this->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        cmSystemTools::Error("Attempt to add a custom rule to output \"" +
                             outName + "\" which already has a custom rule.");
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file =
        this->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Always create the output sources and mark them generated.
  for (std::string const& o : outputs) {
    if (cmSourceFile* out =
          this->GetOrCreateSource(o, true, cmSourceFileLocationKind::Known)) {
      out->SetProperty("GENERATED", "1");
    }
  }
  for (std::string const& o : byproducts) {
    if (cmSourceFile* out =
          this->GetOrCreateSource(o, true, cmSourceFileLocationKind::Known)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Attach the custom command to the file.
  if (file) {
    // Construct a complete list of dependencies.
    std::vector<std::string> depends2(depends);
    if (!main_dependency.empty()) {
      depends2.push_back(main_dependency);
    }

    cmCustomCommand* cc = new cmCustomCommand(
      this, outputs, byproducts, depends2, commandLines, comment, workingDir);
    cc->SetEscapeOldStyle(escapeOldStyle);
    cc->SetEscapeAllowMakeVars(true);
    cc->SetUsesTerminal(uses_terminal);
    cc->SetCommandExpandLists(command_expand_lists);
    cc->SetDepfile(depfile);
    cc->SetJobPool(job_pool);
    file->SetCustomCommand(cc);
    this->UpdateOutputToSourceMap(outputs, file);
  }
  return file;
}